

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

uint32_t chacha_next32(mi_random_ctx_t *ctx)

{
  uint32_t uVar1;
  int iVar2;
  
  iVar2 = ctx->output_available;
  if (ctx->output_available < 1) {
    chacha_block(ctx);
    ctx->output_available = 0x10;
    iVar2 = 0x10;
  }
  uVar1 = ctx->output[0x10 - iVar2];
  ctx->output[0x10 - iVar2] = 0;
  ctx->output_available = ctx->output_available + -1;
  return uVar1;
}

Assistant:

static uint32_t chacha_next32(mi_random_ctx_t* ctx) {
  if (ctx->output_available <= 0) {
    chacha_block(ctx);
    ctx->output_available = 16; // (assign again to suppress static analysis warning)
  }
  const uint32_t x = ctx->output[16 - ctx->output_available];
  ctx->output[16 - ctx->output_available] = 0; // reset once the data is handed out
  ctx->output_available--;
  return x;
}